

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O1

int tclpkcs11_importcert(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  _func_char_ptr_uint *p_Var1;
  Tcl_Obj *pTVar2;
  tclpkcs11_handle *handle;
  int iVar3;
  uchar *outbuf;
  unsigned_long buflen;
  Tcl_Obj *pTVar4;
  char *pcVar5;
  CK_SLOT_ID slot;
  ProcErrorProc *pPVar6;
  CK_RV CVar7;
  uint uVar8;
  long lVar9;
  CK_ULONG foundObjs;
  int tcl_keylist_llength;
  CK_OBJECT_HANDLE hObject;
  CK_ATTRIBUTE attr_update [1];
  Tcl_Obj **tcl_keylist_values;
  CK_OBJECT_HANDLE pub_key;
  CK_ATTRIBUTE template [2];
  CK_MECHANISM mechanism_desc_sha1;
  CK_ULONG resultbuf_len;
  long serial_num;
  x509_object x509;
  CK_ULONG local_3e0;
  uint local_3d4;
  CK_OBJECT_HANDLE local_3d0;
  Tcl_Obj *local_3c8;
  Tcl_Obj *local_3c0;
  CK_ATTRIBUTE local_3b8;
  ClientData local_3a0;
  Tcl_Obj **local_398;
  CK_OBJECT_HANDLE local_390;
  CK_ATTRIBUTE local_388;
  undefined8 uStack_370;
  undefined8 *local_368;
  undefined8 uStack_360;
  CK_ATTRIBUTE local_358;
  undefined8 local_340;
  undefined8 *local_338;
  undefined8 local_330;
  undefined8 local_328;
  CK_BYTE_PTR local_320;
  unsigned_long uStack_318;
  undefined8 local_310;
  undefined1 *local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  size_t sStack_2d0;
  undefined8 local_2c8;
  void *local_2c0;
  unsigned_long uStack_2b8;
  undefined8 local_2b0;
  void *local_2a8;
  unsigned_long uStack_2a0;
  undefined8 local_298;
  uchar *local_290;
  unsigned_long uStack_288;
  undefined8 local_280;
  CK_ULONG *local_278;
  unsigned_long local_270;
  CK_MECHANISM local_268;
  CK_ULONG local_248 [2];
  x509_object local_238;
  
  local_390 = 0;
  local_278 = local_248 + 1;
  local_248[1] = 0;
  local_268.ulParameterLen = 0;
  local_268.mechanism = 0x220;
  local_268.pParameter = (CK_VOID_PTR)0x0;
  local_358.type = 0;
  local_358.pValue = &tclpkcs11_perform_pki_importcert_oclass_cert;
  local_358.ulValueLen = 8;
  local_340 = 0x80;
  local_338 = &tclpkcs11_perform_pki_importcert_ocert_type;
  local_330 = 8;
  local_328 = 0x102;
  local_320 = (CK_BYTE_PTR)0x0;
  uStack_318 = 0;
  local_310 = 1;
  local_308 = &tclpkcs11_perform_pki_importcert_ltrue;
  local_300 = 1;
  local_2f8 = 2;
  local_2f0 = &tclpkcs11_perform_pki_importcert_lfalse;
  local_2e8 = 1;
  local_2e0 = 3;
  local_2d8 = (char *)0x0;
  sStack_2d0 = 0;
  local_2c8 = 0x101;
  local_2c0 = (void *)0x0;
  uStack_2b8 = 0;
  local_2b0 = 0x81;
  local_2a8 = (void *)0x0;
  uStack_2a0 = 0;
  local_298 = 0x11;
  local_290 = (uchar *)0x0;
  uStack_288 = 0;
  local_280 = 0x82;
  local_270 = 8;
  local_388.pValue = (CK_BYTE_PTR)0x0;
  local_368 = (undefined8 *)0x0;
  uStack_360 = 0;
  local_388.ulValueLen = 0;
  uStack_370 = 0;
  local_388.type = 0x102;
  local_3b8.ulValueLen = 0;
  local_3b8.type = 3;
  local_3b8.pValue = (char *)0x0;
  if (objc != 3) {
    pPVar6 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::importcert cert_der_hex list_token_and_cka\""
                        ,-1);
    goto LAB_00107c12;
  }
  pTVar4 = objv[1];
  p_Var1 = tclStubsPtr->tcl_Alloc;
  local_3a0 = cd;
  iVar3 = (*tclStubsPtr->tcl_GetCharLength)(pTVar4);
  outbuf = (uchar *)(*p_Var1)(iVar3 / 2);
  iVar3 = (*tclStubsPtr->tcl_GetCharLength)(pTVar4);
  buflen = tclpkcs11_string_to_bytearray(pTVar4,outbuf,(long)(iVar3 / 2));
  iVar3 = asn1_x509_read_object(outbuf,buflen,&local_238);
  if (iVar3 == -1) {
    pPVar6 = tclStubsPtr->tcl_SetObjResult;
    pcVar5 = "bad certificate";
LAB_00107b59:
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)(pcVar5,-1);
    goto LAB_00107c12;
  }
  local_2c0 = local_238.subject.asn1rep;
  uStack_2b8 = local_238.subject.asn1rep_len;
  local_2a8 = local_238.issuer.asn1rep;
  uStack_2a0 = local_238.issuer.asn1rep_len;
  local_278 = (CK_ULONG *)local_238.serial_number.asn1rep;
  local_270 = local_238.serial_number.asn1rep_len;
  pTVar4 = objv[2];
  local_290 = outbuf;
  uStack_288 = buflen;
  if (1 < pTVar4->refCount) {
    pTVar4 = (*tclStubsPtr->tcl_DuplicateObj)(pTVar4);
  }
  iVar3 = (*tclStubsPtr->tcl_ListObjGetElements)
                    ((Tcl_Interp_conflict *)interp,pTVar4,(int *)&local_3d4,&local_398);
  if (iVar3 != 0) {
    return iVar3;
  }
  if ((local_3d4 & 1) == 0) {
    uVar8 = 0;
    if ((int)local_3d4 < 1) {
      local_3c8 = (Tcl_Obj *)0x0;
      pTVar4 = (Tcl_Obj *)0x0;
    }
    else {
      lVar9 = 0;
      local_3c0 = (Tcl_Obj *)0x0;
      local_3c8 = (Tcl_Obj *)0x0;
      do {
        pTVar4 = local_398[lVar9];
        pTVar2 = local_398[lVar9 + 1];
        pcVar5 = (*tclStubsPtr->tcl_GetString)(pTVar4);
        iVar3 = strcmp(pcVar5,"pkcs11_handle");
        if (iVar3 == 0) {
          uVar8 = uVar8 + 1;
          local_3c0 = pTVar2;
        }
        else {
          pcVar5 = (*tclStubsPtr->tcl_GetString)(pTVar4);
          iVar3 = strcmp(pcVar5,"pkcs11_slotid");
          if (iVar3 == 0) {
            uVar8 = uVar8 + 1;
            local_3c8 = pTVar2;
          }
          else {
            pcVar5 = (*tclStubsPtr->tcl_GetString)(pTVar4);
            iVar3 = strcmp(pcVar5,"pkcs11_label");
            if (iVar3 == 0) {
              local_2d8 = (*tclStubsPtr->tcl_GetString)(pTVar2);
              pcVar5 = (*tclStubsPtr->tcl_GetString)(pTVar2);
              sStack_2d0 = strlen(pcVar5);
              local_3b8.pValue = (*tclStubsPtr->tcl_GetString)(pTVar2);
              local_3b8.ulValueLen = sStack_2d0;
              uVar8 = uVar8 + 1;
            }
          }
        }
        lVar9 = lVar9 + 2;
      } while ((int)lVar9 < (int)local_3d4);
      uVar8 = (uint)(uVar8 == 3);
      pTVar4 = local_3c0;
    }
    if ((char)uVar8 == '\0') {
      pPVar6 = tclStubsPtr->tcl_SetObjResult;
      pcVar5 = "invalid  handle or slot or param";
    }
    else {
      lVar9 = (**(code **)((long)local_3a0 + 0x40))(local_3a0,pTVar4);
      if ((lVar9 != 0) &&
         (handle = *(tclpkcs11_handle **)(lVar9 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
        pcVar5 = (*tclStubsPtr->tcl_GetString)(local_3c8);
        slot = atol(pcVar5);
        iVar3 = tclpkcs11_start_session(handle,slot);
        if (iVar3 == 0) {
          local_388.pValue = (*tclStubsPtr->tcl_Alloc)(0x14);
          local_388.ulValueLen = 0x14;
          CVar7 = (*handle->pkcs11->C_DigestInit)(handle->session,&local_268);
          if (CVar7 == 0) {
            local_248[0] = 0x14;
            CVar7 = (*handle->pkcs11->C_Digest)
                              (handle->session,(CK_BYTE_PTR)((long)local_238.pubkey.contents + 1),
                               local_238.pubkey.size - 1,(CK_BYTE_PTR)local_388.pValue,local_248);
            if (CVar7 == 0) {
              local_320 = (CK_BYTE_PTR)local_388.pValue;
              uStack_318 = local_388.ulValueLen;
              local_368 = &tclpkcs11_perform_pki_importcert_oclass_cert;
              uStack_360 = 8;
              CVar7 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_388,2);
              if (CVar7 == 0) {
                CVar7 = (*handle->pkcs11->C_FindObjects)(handle->session,&local_3d0,1,&local_3e0);
                if (CVar7 != 0) {
                  pPVar6 = tclStubsPtr->tcl_SetObjResult;
                  pTVar4 = tclpkcs11_pkcs11_error(CVar7);
                  goto LAB_00107d29;
                }
                (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                if (local_3e0 != 0) {
                  pPVar6 = tclStubsPtr->tcl_SetObjResult;
                  pcVar5 = "Certificate with the CKA_ID exist";
                  goto LAB_00107c04;
                }
                CVar7 = (*handle->pkcs11->C_CreateObject)(handle->session,&local_358,10,&local_390);
                if (CVar7 != 0) {
                  if (CVar7 == 0x101) {
                    pPVar6 = tclStubsPtr->tcl_SetObjResult;
                    pcVar5 = "importcert: cannot create object for certificate, not logged";
                  }
                  else {
                    pPVar6 = tclStubsPtr->tcl_SetObjResult;
                    pcVar5 = "importcert: cannot create object for certificate";
                  }
                  goto LAB_00107b59;
                }
                local_368 = &tclpkcs11_perform_pki_importcert_oclass_pub;
                uStack_360 = 8;
                CVar7 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_388,2);
                if (CVar7 == 0) {
                  CVar7 = (*handle->pkcs11->C_FindObjects)(handle->session,&local_3d0,1,&local_3e0);
                  if (CVar7 == 0) {
                    (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                    if (local_3e0 == 1) {
                      (*handle->pkcs11->C_SetAttributeValue)(handle->session,local_3d0,&local_3b8,1)
                      ;
                    }
                    local_368 = &tclpkcs11_perform_pki_importcert_oclass_priv;
                    uStack_360 = 8;
                    CVar7 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_388,2);
                    if (CVar7 != 0) goto LAB_00107de0;
                    CVar7 = (*handle->pkcs11->C_FindObjects)
                                      (handle->session,&local_3d0,1,&local_3e0);
                    if (CVar7 == 0) {
                      (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                      if (local_3e0 == 1) {
                        (*handle->pkcs11->C_SetAttributeValue)
                                  (handle->session,local_3d0,&local_3b8,1);
                      }
                      pTVar4 = tclpkcs11_bytearray_to_string(local_320,uStack_318);
                      (*tclStubsPtr->tcl_Free)((char *)local_320);
                      (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar4);
                      return 0;
                    }
                  }
                  pPVar6 = tclStubsPtr->tcl_SetObjResult;
                  pTVar4 = tclpkcs11_pkcs11_error(CVar7);
LAB_00107d29:
                  (*pPVar6)((Tcl_Interp_conflict *)interp,pTVar4);
                  (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                  return 1;
                }
LAB_00107de0:
                pPVar6 = tclStubsPtr->tcl_SetObjResult;
                pTVar4 = tclpkcs11_pkcs11_error(CVar7);
                goto LAB_00107c12;
              }
            }
          }
          pPVar6 = tclStubsPtr->tcl_SetObjResult;
        }
        else {
          CVar7 = (CK_RV)iVar3;
          pPVar6 = tclStubsPtr->tcl_SetObjResult;
        }
        pTVar4 = tclpkcs11_pkcs11_error(CVar7);
        goto LAB_00107c12;
      }
      pPVar6 = tclStubsPtr->tcl_SetObjResult;
      pcVar5 = "invalid handle";
    }
  }
  else {
    pPVar6 = tclStubsPtr->tcl_SetObjResult;
    pcVar5 = "list must have an even number of elements";
  }
LAB_00107c04:
  pTVar4 = (*tclStubsPtr->tcl_NewStringObj)(pcVar5,-1);
LAB_00107c12:
  (*pPVar6)((Tcl_Interp_conflict *)interp,pTVar4);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_importcert(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "ImportCert START\n");
  return(tclpkcs11_perform_pki_importcert(cd, interp, objc, objv));
}